

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M3DImporter.cpp
# Opt level: O3

void __thiscall
Assimp::M3DImporter::populateMesh
          (M3DImporter *this,M3DWrapper *m3d,aiMesh *pMesh,
          vector<aiFace,_std::allocator<aiFace>_> *faces,
          vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *vertices,
          vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *normals,
          vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *texcoords,
          vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *colors,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *vertexids)

{
  pointer paVar1;
  pointer __src;
  m3ds_t *pmVar2;
  long *plVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  ulong *puVar7;
  aiFace *paVar8;
  aiVector3D *paVar9;
  aiColor4D *__s;
  aiBone **ppaVar10;
  aiBone *paVar11;
  aiNode *paVar12;
  aiVertexWeight *__s_00;
  pointer puVar13;
  pointer puVar14;
  uint k;
  M3DWrapper *pMVar15;
  M3DImporter *pMVar16;
  aiBone *pBone;
  pointer o;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pvVar17;
  uint uVar18;
  aiFace *this_00;
  ulong uVar19;
  aiMesh *paVar20;
  size_t sVar21;
  aiString name;
  allocator<char> local_889;
  aiMesh *local_888;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *local_880;
  M3DImporter *local_878;
  M3DWrapper *local_870;
  long *local_868;
  ulong local_860;
  long local_858 [2];
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *local_848;
  ulong local_840;
  undefined1 local_838 [1028];
  aiString local_434;
  
  local_880 = normals;
  local_878 = this;
  if (pMesh == (aiMesh *)0x0) {
    __assert_fail("pMesh != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x29c,
                  "void Assimp::M3DImporter::populateMesh(const M3DWrapper &, aiMesh *, std::vector<aiFace> *, std::vector<aiVector3D> *, std::vector<aiVector3D> *, std::vector<aiVector3D> *, std::vector<aiColor4D> *, std::vector<unsigned int> *)"
                 );
  }
  if (faces == (vector<aiFace,_std::allocator<aiFace>_> *)0x0) {
    __assert_fail("faces != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x29d,
                  "void Assimp::M3DImporter::populateMesh(const M3DWrapper &, aiMesh *, std::vector<aiFace> *, std::vector<aiVector3D> *, std::vector<aiVector3D> *, std::vector<aiVector3D> *, std::vector<aiColor4D> *, std::vector<unsigned int> *)"
                 );
  }
  if (vertices == (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)0x0) {
    __assert_fail("vertices != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x29e,
                  "void Assimp::M3DImporter::populateMesh(const M3DWrapper &, aiMesh *, std::vector<aiFace> *, std::vector<aiVector3D> *, std::vector<aiVector3D> *, std::vector<aiVector3D> *, std::vector<aiColor4D> *, std::vector<unsigned int> *)"
                 );
  }
  if (normals == (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)0x0) {
    __assert_fail("normals != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x29f,
                  "void Assimp::M3DImporter::populateMesh(const M3DWrapper &, aiMesh *, std::vector<aiFace> *, std::vector<aiVector3D> *, std::vector<aiVector3D> *, std::vector<aiVector3D> *, std::vector<aiColor4D> *, std::vector<unsigned int> *)"
                 );
  }
  if (texcoords == (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)0x0) {
    __assert_fail("texcoords != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x2a0,
                  "void Assimp::M3DImporter::populateMesh(const M3DWrapper &, aiMesh *, std::vector<aiFace> *, std::vector<aiVector3D> *, std::vector<aiVector3D> *, std::vector<aiVector3D> *, std::vector<aiColor4D> *, std::vector<unsigned int> *)"
                 );
  }
  if (colors == (vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)0x0) {
    __assert_fail("colors != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x2a1,
                  "void Assimp::M3DImporter::populateMesh(const M3DWrapper &, aiMesh *, std::vector<aiFace> *, std::vector<aiVector3D> *, std::vector<aiVector3D> *, std::vector<aiVector3D> *, std::vector<aiColor4D> *, std::vector<unsigned int> *)"
                 );
  }
  if (vertexids == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    __assert_fail("vertexids != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x2a2,
                  "void Assimp::M3DImporter::populateMesh(const M3DWrapper &, aiMesh *, std::vector<aiFace> *, std::vector<aiVector3D> *, std::vector<aiVector3D> *, std::vector<aiVector3D> *, std::vector<aiColor4D> *, std::vector<unsigned int> *)"
                 );
  }
  if (m3d->m3d_ == (m3d_t *)0x0) {
    __assert_fail("m3d",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x2a3,
                  "void Assimp::M3DImporter::populateMesh(const M3DWrapper &, aiMesh *, std::vector<aiFace> *, std::vector<aiVector3D> *, std::vector<aiVector3D> *, std::vector<aiVector3D> *, std::vector<aiColor4D> *, std::vector<unsigned int> *)"
                 );
  }
  local_888 = (aiMesh *)DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[31]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_838,
             (char (*) [31])"M3D: populateMesh numvertices ");
  std::ostream::_M_insert<unsigned_long>((ulong)local_838);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_838," numfaces ",10);
  std::ostream::_M_insert<unsigned_long>((ulong)local_838);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_838," numnormals ",0xc);
  std::ostream::_M_insert<unsigned_long>((ulong)local_838);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_838," numtexcoord ",0xd);
  std::ostream::_M_insert<unsigned_long>((ulong)local_838);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_838," numbones ",10);
  std::ostream::_M_insert<unsigned_long>((ulong)local_838);
  std::__cxx11::stringbuf::str();
  Logger::debug((Logger *)local_888,(char *)local_868);
  if (local_868 != local_858) {
    operator_delete(local_868,local_858[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_838);
  std::ios_base::~ios_base((ios_base *)(local_838 + 0x70));
  if (((vertices->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish !=
       (vertices->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_start) &&
     (lVar5 = (long)(faces->super__Vector_base<aiFace,_std::allocator<aiFace>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(faces->super__Vector_base<aiFace,_std::allocator<aiFace>_>)._M_impl.
                    super__Vector_impl_data._M_start, lVar5 != 0)) {
    uVar6 = lVar5 >> 4;
    pMesh->mNumFaces = (uint)uVar6;
    uVar6 = uVar6 & 0xffffffff;
    local_888 = pMesh;
    local_870 = m3d;
    local_848 = vertices;
    puVar7 = (ulong *)operator_new__(uVar6 * 0x10 + 8);
    *puVar7 = uVar6;
    this_00 = (aiFace *)(puVar7 + 1);
    if (uVar6 != 0) {
      paVar8 = this_00;
      do {
        paVar8->mNumIndices = 0;
        paVar8->mIndices = (uint *)0x0;
        paVar8 = paVar8 + 1;
      } while (paVar8 != this_00 + uVar6);
    }
    local_888->mFaces = this_00;
    o = (faces->super__Vector_base<aiFace,_std::allocator<aiFace>_>)._M_impl.super__Vector_impl_data
        ._M_start;
    lVar5 = (long)(faces->super__Vector_base<aiFace,_std::allocator<aiFace>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)o >> 4;
    if (0 < lVar5) {
      uVar6 = lVar5 + 1;
      do {
        aiFace::operator=(this_00,o);
        o = o + 1;
        this_00 = this_00 + 1;
        uVar6 = uVar6 - 1;
      } while (1 < uVar6);
    }
    uVar19 = ((long)(local_848->
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(local_848->
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
    uVar18 = (uint)uVar19;
    local_888->mNumVertices = uVar18;
    uVar19 = uVar19 & 0xffffffff;
    uVar6 = uVar19 * 0xc;
    paVar9 = (aiVector3D *)operator_new__(uVar6);
    local_840 = uVar19;
    if (uVar19 != 0) {
      memset(paVar9,0,((uVar6 - 0xc) / 0xc) * 0xc + 0xc);
    }
    local_888->mVertices = paVar9;
    paVar1 = (local_848->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
             ._M_impl.super__Vector_impl_data._M_start;
    sVar21 = (long)(local_848->
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_finish - (long)paVar1;
    if (sVar21 != 0) {
      memmove(paVar9,paVar1,sVar21);
    }
    if ((long)(local_880->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(local_880->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
              )._M_impl.super__Vector_impl_data._M_start == sVar21) {
      paVar9 = (aiVector3D *)operator_new__(uVar6);
      if (uVar18 != 0) {
        memset(paVar9,0,((uVar6 - 0xc) / 0xc) * 0xc + 0xc);
      }
      local_888->mNormals = paVar9;
      paVar1 = (local_880->
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
               super__Vector_impl_data._M_start;
      sVar21 = (long)(local_880->
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)paVar1;
      if (sVar21 != 0) {
        memmove(paVar9,paVar1,sVar21);
      }
    }
    lVar5 = (long)(local_848->
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(local_848->
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_start;
    if ((long)(texcoords->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(texcoords->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
              )._M_impl.super__Vector_impl_data._M_start == lVar5) {
      paVar9 = (aiVector3D *)operator_new__(uVar6);
      if (uVar18 != 0) {
        memset(paVar9,0,((uVar6 - 0xc) / 0xc) * 0xc + 0xc);
      }
      local_888->mTextureCoords[0] = paVar9;
      paVar1 = (texcoords->
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
               super__Vector_impl_data._M_start;
      sVar21 = (long)(texcoords->
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)paVar1;
      if (sVar21 != 0) {
        memmove(paVar9,paVar1,sVar21);
      }
      local_888->mNumUVComponents[0] = 2;
      lVar5 = (long)(local_848->
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(local_848->
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                    _M_impl.super__Vector_impl_data._M_start;
    }
    pMVar15 = local_870;
    if ((long)(colors->super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>).
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(colors->super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>).
              _M_impl.super__Vector_impl_data._M_start >> 4 == (lVar5 >> 2) * -0x5555555555555555) {
      uVar6 = local_840 << 4;
      __s = (aiColor4D *)operator_new__(uVar6);
      if (uVar18 != 0) {
        memset(__s,0,uVar6);
      }
      local_888->mColors[0] = __s;
      __src = (colors->super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
      sVar21 = (long)(colors->
                     super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)__src;
      if (sVar21 != 0) {
        memmove(__s,__src,sVar21);
      }
    }
    paVar20 = local_888;
    uVar18 = pMVar15->m3d_->numbone;
    local_888->mNumBones = uVar18;
    if ((ulong)uVar18 != 0) {
      ppaVar10 = (aiBone **)operator_new__((ulong)uVar18 << 3);
      paVar20->mBones = ppaVar10;
      if (pMVar15->m3d_->numbone != 0) {
        pvVar17 = (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)0x1;
        uVar6 = 0;
        do {
          paVar11 = (aiBone *)operator_new(0x460);
          (paVar11->mName).length = 0;
          (paVar11->mName).data[0] = '\0';
          memset((paVar11->mName).data + 1,0x1b,0x3ff);
          paVar11->mNumWeights = 0;
          paVar11->mWeights = (aiVertexWeight *)0x0;
          (paVar11->mOffsetMatrix).a1 = 1.0;
          (paVar11->mOffsetMatrix).a2 = 0.0;
          (paVar11->mOffsetMatrix).a3 = 0.0;
          (paVar11->mOffsetMatrix).a4 = 0.0;
          (paVar11->mOffsetMatrix).b1 = 0.0;
          (paVar11->mOffsetMatrix).b2 = 1.0;
          (paVar11->mOffsetMatrix).b3 = 0.0;
          (paVar11->mOffsetMatrix).b4 = 0.0;
          (paVar11->mOffsetMatrix).c1 = 0.0;
          (paVar11->mOffsetMatrix).c2 = 0.0;
          (paVar11->mOffsetMatrix).c3 = 1.0;
          (paVar11->mOffsetMatrix).c4 = 0.0;
          (paVar11->mOffsetMatrix).d1 = 0.0;
          (paVar11->mOffsetMatrix).d2 = 0.0;
          (paVar11->mOffsetMatrix).d3 = 0.0;
          (paVar11->mOffsetMatrix).d4 = 1.0;
          paVar20->mBones[uVar6] = paVar11;
          local_880 = pvVar17;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_868,
                     *(char **)(pMVar15->m3d_->bone->mat4 + (long)pvVar17 * 2 + -10),&local_889);
          sVar21 = local_860 & 0xffffffff;
          if ((local_860 & 0xfffffc00) != 0) {
            sVar21 = 0x3ff;
          }
          local_838._0_4_ = (ai_uint32)sVar21;
          memcpy(local_838 + 4,local_868,sVar21);
          local_838[sVar21 + 4] = 0;
          paVar11 = paVar20->mBones[uVar6];
          (paVar11->mName).length = (ai_uint32)sVar21;
          memcpy((paVar11->mName).data,local_838 + 4,sVar21);
          (paVar11->mName).data[sVar21] = '\0';
          if (local_868 != local_858) {
            operator_delete(local_868,local_858[0] + 1);
          }
          pMVar16 = local_878;
          paVar20->mBones[uVar6]->mNumWeights = 0;
          paVar12 = local_878->mScene->mRootNode;
          local_434.length = (paVar20->mBones[uVar6]->mName).length;
          if (0x3fe < local_434.length) {
            local_434.length = 0x3ff;
          }
          uVar19 = (ulong)local_434.length;
          memcpy(local_434.data,(paVar20->mBones[uVar6]->mName).data,uVar19);
          paVar20 = local_888;
          local_434.data[uVar19] = '\0';
          paVar12 = findNode(pMVar16,paVar12,&local_434);
          paVar11 = paVar20->mBones[uVar6];
          if (paVar12 == (aiNode *)0x0) {
            (paVar11->mOffsetMatrix).a1 = 1.0;
            (paVar11->mOffsetMatrix).a2 = 0.0;
            (paVar11->mOffsetMatrix).a3 = 0.0;
            (paVar11->mOffsetMatrix).a4 = 0.0;
            (paVar11->mOffsetMatrix).b1 = 0.0;
            (paVar11->mOffsetMatrix).b2 = 1.0;
            (paVar11->mOffsetMatrix).b3 = 0.0;
            (paVar11->mOffsetMatrix).b4 = 0.0;
            (paVar11->mOffsetMatrix).c1 = 0.0;
            (paVar11->mOffsetMatrix).c2 = 0.0;
            (paVar11->mOffsetMatrix).c3 = 1.0;
            (paVar11->mOffsetMatrix).c4 = 0.0;
            (paVar11->mOffsetMatrix).d1 = 0.0;
            (paVar11->mOffsetMatrix).d2 = 0.0;
            (paVar11->mOffsetMatrix).d3 = 0.0;
            (paVar11->mOffsetMatrix).d4 = 1.0;
          }
          else {
            calculateOffsetMatrix(pMVar16,paVar12,&paVar11->mOffsetMatrix);
            aiMatrix4x4t<float>::Inverse(&paVar20->mBones[uVar6]->mOffsetMatrix);
          }
          uVar6 = uVar6 + 1;
          pvVar17 = (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                    ((long)&(local_880->
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish + 5);
          pMVar15 = local_870;
        } while (uVar6 < local_870->m3d_->numbone);
      }
      puVar13 = (vertexids->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                .super__Vector_impl_data._M_start;
      puVar14 = (vertexids->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                .super__Vector_impl_data._M_finish;
      if (puVar14 != puVar13) {
        pMVar16 = (M3DImporter *)0x0;
        do {
          uVar18 = pMVar15->m3d_->vertex[puVar13[(long)pMVar16]].skinid;
          if (uVar18 >> 1 < 0x7fffffff) {
            local_880 = (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                        ((ulong)uVar18 << 5);
            lVar5 = 0;
            local_878 = pMVar16;
            do {
              pmVar2 = pMVar15->m3d_->skin;
              if (*(float *)((long)&(local_880->
                                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start +
                            (long)(pmVar2->weight + lVar5)) <= 0.0) break;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_868,
                         pMVar15->m3d_->bone
                         [*(uint *)((long)&(local_880->
                                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start +
                                   (long)(pmVar2->boneid + lVar5))].name,&local_889);
              plVar3 = local_868;
              sVar21 = local_860 & 0xffffffff;
              if ((local_860 & 0xfffffc00) != 0) {
                sVar21 = 0x3ff;
              }
              local_838._0_4_ = (ai_uint32)sVar21;
              memcpy(local_838 + 4,local_868,sVar21);
              local_838[sVar21 + 4] = 0;
              if (plVar3 != local_858) {
                operator_delete(plVar3,local_858[0] + 1);
              }
              uVar18 = paVar20->mNumBones;
              if ((ulong)uVar18 != 0) {
                ppaVar10 = local_888->mBones;
                uVar6 = 0;
                do {
                  paVar11 = ppaVar10[uVar6];
                  if (((paVar11->mName).length == (ai_uint32)sVar21) &&
                     (iVar4 = bcmp((paVar11->mName).data,local_838 + 4,sVar21), iVar4 == 0)) {
                    paVar11->mNumWeights = paVar11->mNumWeights + 1;
                    break;
                  }
                  uVar6 = uVar6 + 1;
                } while (uVar18 != uVar6);
              }
              lVar5 = lVar5 + 1;
              pMVar15 = local_870;
              paVar20 = local_888;
            } while (lVar5 != 4);
            puVar13 = (vertexids->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            puVar14 = (vertexids->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_finish;
            pMVar16 = local_878;
          }
          pMVar16 = (M3DImporter *)(ulong)((int)pMVar16 + 1);
        } while (pMVar16 < (M3DImporter *)((long)puVar14 - (long)puVar13 >> 2));
        uVar18 = paVar20->mNumBones;
        if (uVar18 != 0) {
          uVar6 = 0;
          do {
            paVar11 = paVar20->mBones[uVar6];
            if ((ulong)paVar11->mNumWeights != 0) {
              uVar19 = (ulong)paVar11->mNumWeights << 3;
              __s_00 = (aiVertexWeight *)operator_new__(uVar19);
              memset(__s_00,0,uVar19);
              paVar11->mWeights = __s_00;
              paVar11->mNumWeights = 0;
              uVar18 = paVar20->mNumBones;
            }
            uVar6 = uVar6 + 1;
          } while (uVar6 < uVar18);
          puVar13 = (vertexids->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          puVar14 = (vertexids->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
          pMVar15 = local_870;
        }
        if (puVar14 != puVar13) {
          local_878 = (M3DImporter *)0x0;
          do {
            uVar18 = pMVar15->m3d_->vertex[puVar13[(long)local_878]].skinid;
            if (uVar18 >> 1 < 0x7fffffff) {
              local_880 = (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                          ((ulong)uVar18 << 5);
              lVar5 = 0;
              do {
                pmVar2 = pMVar15->m3d_->skin;
                if (*(float *)((long)pmVar2->weight + lVar5 * 4 + (long)local_880) <= 0.0) break;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_868,
                           pMVar15->m3d_->bone
                           [*(uint *)((long)pmVar2->boneid + lVar5 * 4 + (long)local_880)].name,
                           &local_889);
                plVar3 = local_868;
                sVar21 = local_860 & 0xffffffff;
                if ((local_860 & 0xfffffc00) != 0) {
                  sVar21 = 0x3ff;
                }
                local_838._0_4_ = (ai_uint32)sVar21;
                memcpy(local_838 + 4,local_868,sVar21);
                local_838[sVar21 + 4] = 0;
                if (plVar3 != local_858) {
                  operator_delete(plVar3,local_858[0] + 1);
                }
                uVar18 = paVar20->mNumBones;
                if ((ulong)uVar18 != 0) {
                  ppaVar10 = local_888->mBones;
                  uVar6 = 0;
                  do {
                    paVar11 = ppaVar10[uVar6];
                    if (((paVar11->mName).length == (ai_uint32)sVar21) &&
                       (iVar4 = bcmp((paVar11->mName).data,local_838 + 4,sVar21), iVar4 == 0)) {
                      paVar11->mWeights[paVar11->mNumWeights].mVertexId = (uint)local_878;
                      paVar11->mWeights[paVar11->mNumWeights].mWeight =
                           *(float *)((long)local_870->m3d_->skin->weight +
                                     lVar5 * 4 + (long)local_880);
                      paVar11->mNumWeights = paVar11->mNumWeights + 1;
                      break;
                    }
                    uVar6 = uVar6 + 1;
                  } while (uVar18 != uVar6);
                }
                lVar5 = lVar5 + 1;
                pMVar15 = local_870;
                paVar20 = local_888;
              } while (lVar5 != 4);
              puVar13 = (vertexids->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                        ._M_impl.super__Vector_impl_data._M_start;
              puVar14 = (vertexids->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                        ._M_impl.super__Vector_impl_data._M_finish;
            }
            local_878 = (M3DImporter *)(ulong)((int)local_878 + 1);
          } while (local_878 < (ulong)((long)puVar14 - (long)puVar13 >> 2));
        }
      }
    }
  }
  return;
}

Assistant:

void M3DImporter::populateMesh(const M3DWrapper &m3d, aiMesh *pMesh, std::vector<aiFace> *faces, std::vector<aiVector3D> *vertices,
		std::vector<aiVector3D> *normals, std::vector<aiVector3D> *texcoords, std::vector<aiColor4D> *colors,
		std::vector<unsigned int> *vertexids) {

	ai_assert(pMesh != nullptr);
	ai_assert(faces != nullptr);
	ai_assert(vertices != nullptr);
	ai_assert(normals != nullptr);
	ai_assert(texcoords != nullptr);
	ai_assert(colors != nullptr);
	ai_assert(vertexids != nullptr);
	ai_assert(m3d);

	ASSIMP_LOG_DEBUG_F("M3D: populateMesh numvertices ", vertices->size(), " numfaces ", faces->size(),
			" numnormals ", normals->size(), " numtexcoord ", texcoords->size(), " numbones ", m3d->numbone);

	if (vertices->size() && faces->size()) {
		pMesh->mNumFaces = static_cast<unsigned int>(faces->size());
		pMesh->mFaces = new aiFace[pMesh->mNumFaces];
		std::copy(faces->begin(), faces->end(), pMesh->mFaces);
		pMesh->mNumVertices = static_cast<unsigned int>(vertices->size());
		pMesh->mVertices = new aiVector3D[pMesh->mNumVertices];
		std::copy(vertices->begin(), vertices->end(), pMesh->mVertices);
		if (normals->size() == vertices->size()) {
			pMesh->mNormals = new aiVector3D[pMesh->mNumVertices];
			std::copy(normals->begin(), normals->end(), pMesh->mNormals);
		}
		if (texcoords->size() == vertices->size()) {
			pMesh->mTextureCoords[0] = new aiVector3D[pMesh->mNumVertices];
			std::copy(texcoords->begin(), texcoords->end(), pMesh->mTextureCoords[0]);
			pMesh->mNumUVComponents[0] = 2;
		}
		if (colors->size() == vertices->size()) {
			pMesh->mColors[0] = new aiColor4D[pMesh->mNumVertices];
			std::copy(colors->begin(), colors->end(), pMesh->mColors[0]);
		}
		// this is complicated, because M3D stores a list of bone id / weight pairs per
		// vertex but assimp uses lists of local vertex id/weight pairs per local bone list
		pMesh->mNumBones = m3d->numbone;
		/* we need aiBone with mOffsetMatrix for bones without weights as well */
		if (pMesh->mNumBones) {
			pMesh->mBones = new aiBone *[pMesh->mNumBones];
			for (unsigned int i = 0; i < m3d->numbone; i++) {
				aiNode *pNode;
				pMesh->mBones[i] = new aiBone;
				pMesh->mBones[i]->mName = aiString(std::string(m3d->bone[i].name));
				pMesh->mBones[i]->mNumWeights = 0;
				pNode = findNode(mScene->mRootNode, pMesh->mBones[i]->mName);
				if (pNode) {
					calculateOffsetMatrix(pNode, &pMesh->mBones[i]->mOffsetMatrix);
					pMesh->mBones[i]->mOffsetMatrix.Inverse();
				} else
					pMesh->mBones[i]->mOffsetMatrix = aiMatrix4x4();
			}
			if (vertexids->size()) {
				unsigned int i, j;
				// first count how many vertices we have per bone
				for (i = 0; i < vertexids->size(); i++) {
					unsigned int s = m3d->vertex[vertexids->at(i)].skinid;
					if (s != M3D_UNDEF && s != M3D_INDEXMAX) {
						for (unsigned int k = 0; k < M3D_NUMBONE && m3d->skin[s].weight[k] > 0.0; k++) {
							aiString name = aiString(std::string(m3d->bone[m3d->skin[s].boneid[k]].name));
							for (j = 0; j < pMesh->mNumBones; j++) {
								if (pMesh->mBones[j]->mName == name) {
									pMesh->mBones[j]->mNumWeights++;
									break;
								}
							}
						}
					}
				}
				// allocate mWeights
				for (j = 0; j < pMesh->mNumBones; j++) {
					aiBone *pBone = pMesh->mBones[j];
					if (pBone->mNumWeights) {
						pBone->mWeights = new aiVertexWeight[pBone->mNumWeights];
						pBone->mNumWeights = 0;
					}
				}
				// fill up with data
				for (i = 0; i < vertexids->size(); i++) {
					unsigned int s = m3d->vertex[vertexids->at(i)].skinid;
					if (s != M3D_UNDEF && s != M3D_INDEXMAX) {
						for (unsigned int k = 0; k < M3D_NUMBONE && m3d->skin[s].weight[k] > 0.0; k++) {
							aiString name = aiString(std::string(m3d->bone[m3d->skin[s].boneid[k]].name));
							for (j = 0; j < pMesh->mNumBones; j++) {
								if (pMesh->mBones[j]->mName == name) {
									aiBone *pBone = pMesh->mBones[j];
									pBone->mWeights[pBone->mNumWeights].mVertexId = i;
									pBone->mWeights[pBone->mNumWeights].mWeight = m3d->skin[s].weight[k];
									pBone->mNumWeights++;
									break;
								}
							}
						} // foreach skin
					}
				} // foreach vertexids
			}
		}
	}
}